

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RepeatLoopIfSetInst::Exec
          (RepeatLoopIfSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  undefined4 uVar3;
  int iVar4;
  Program *pPVar5;
  PageAllocation *pPVar6;
  size_t sVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  long lVar11;
  LoopInfo *pLVar12;
  int i;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ArenaAllocator *alloc;
  
  uVar15 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar15 + 0x43) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar9) goto LAB_00f0c647;
    *puVar10 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar15] != 'G') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar9) goto LAB_00f0c647;
    *puVar10 = 0;
  }
  pPVar5 = (matcher->program).ptr;
  lVar11 = *(long *)&pPVar5->rep;
  iVar13 = *(int *)(lVar11 + 0x29 + uVar15);
  if (((long)iVar13 < 0) || (pPVar5->numLoops <= iVar13)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar9) goto LAB_00f0c647;
    *puVar10 = 0;
  }
  lVar11 = lVar11 + uVar15;
  pLVar12 = (matcher->loopInfos).ptr + iVar13;
  if (*(char *)(lVar11 + 0x36) == '\x01') {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00f0c647;
      *puVar10 = 0;
    }
    pPVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar7 + 0x28;
    *(size_t *)((long)&pPVar6[1].pageCount + sVar7) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    uVar3 = *(undefined4 *)(lVar11 + 0x29);
    *(undefined1 *)((long)&pPVar6[2].pageCount + sVar7) = 1;
    *(undefined ***)((long)&pPVar6[1].segment + sVar7) = &PTR_Print_01559968;
    *(undefined4 *)((long)&pPVar6[2].pageCount + sVar7 + 4) = uVar3;
    *(CharCount *)((long)&pPVar6[2].segment + sVar7) = pLVar12->number;
    *(CharCount *)((long)&pPVar6[2].segment + sVar7 + 4) = pLVar12->startInputOffset;
    *(undefined8 *)((long)&pPVar6[3].pageCount + sVar7) = 0;
    if (pLVar12->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014ea098;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar6[3].pageCount + sVar7) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar12->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  pLVar12->number = pLVar12->number + 1;
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if (*inputOffset < inputLength) {
    CVar2 = input[*inputOffset];
    if ((ushort)CVar2 < 0x100) {
      bVar9 = (*(uint *)(lVar11 + 9 + (ulong)((ushort)CVar2 >> 5) * 4) >> ((ushort)CVar2 & 0x1f) & 1
              ) != 0;
    }
    else {
      if (((RuntimeCharSet<char16_t> *)(lVar11 + 1))->root == (CharSetNode *)0x0) goto LAB_00f0c47c;
      bVar9 = RuntimeCharSet<char16_t>::Get_helper
                        ((RuntimeCharSet<char16_t> *)(lVar11 + 1),(uint)(ushort)CVar2);
    }
    if (bVar9 != false) {
      if ((*(uint *)(lVar11 + 0x31) != 0xffffffff) && (*(uint *)(lVar11 + 0x31) <= pLVar12->number))
      goto LAB_00f0c487;
      if (*(char *)(lVar11 + 0x36) == '\x01') {
        if (-1 < *(int *)(lVar11 + 0x3f)) {
          Matcher::DoSaveInnerGroups
                    (matcher,*(int *)(lVar11 + 0x3b),*(int *)(lVar11 + 0x3f),true,input,contStack);
        }
      }
      else {
        iVar13 = *(int *)(lVar11 + 0x3b);
        iVar4 = *(int *)(lVar11 + 0x3f);
        if (iVar13 <= iVar4) {
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          do {
            if ((iVar13 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar13)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                                 ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                                 "groupId >= 0 && groupId < program->numGroups");
              if (!bVar9) goto LAB_00f0c647;
              *puVar10 = 0;
            }
            (matcher->groupInfos).ptr[iVar13].length = 0xffffffff;
            iVar13 = iVar13 + 1;
          } while (iVar13 <= iVar4);
        }
      }
      uVar14 = (this->super_RepeatLoopMixin).beginLabel + 0x43;
      if (uVar14 < (((matcher->program).ptr)->rep).insts.instsLen) {
LAB_00f0c624:
        *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar14;
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (bVar9) {
        *puVar10 = 0;
        goto LAB_00f0c624;
      }
      goto LAB_00f0c647;
    }
  }
LAB_00f0c47c:
  if (pLVar12->number < *(uint *)(lVar11 + 0x2d)) {
LAB_00f0c487:
    bVar9 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    return bVar9;
  }
  uVar14 = *(uint *)(lVar11 + 0x37);
  if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar9) {
LAB_00f0c647:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar14;
  return false;
}

Assistant:

inline bool RepeatLoopIfSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopIfSetInst* begin = matcher.L2I(BeginLoopIfSet, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (begin->hasInnerNondet)
        {
            // May end up backtracking into loop body for iteration just completed: see above.
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && begin->set.Get(input[inputOffset]))
        {
            if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
            {
                // If the loop body's first set and the loop's follow set are disjoint, we can just fail here since
                // we know the next character in the input is in the loop body's first set.
                return matcher.Fail(FAIL_PARAMETERS);
            }

            // Commit to one more iteration
            if (begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopIfSetInst));
            return false;
        }

        if (loopInfo->number < begin->repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        // Proceed to exit
        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return false;
    }